

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
          *handler)

{
  internal *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  bool bVar4;
  internal iVar5;
  internal *piVar6;
  void *pvVar7;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_1;
  internal *end;
  char *message;
  type size_1;
  size_t sVar8;
  internal *piVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  type size;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
             *)format_str.size_;
  end = (internal *)(format_str.data_ + (long)this);
  do {
    if (this == end) {
      return;
    }
    piVar6 = this;
    if ((*this == (internal)0x7b) ||
       (piVar6 = (internal *)memchr(this,0x7b,(long)end - (long)this), piVar9 = this,
       piVar6 != (internal *)0x0)) {
      piVar9 = this;
      if (this != piVar6) {
        do {
          sVar8 = (long)piVar6 - (long)piVar9;
          pvVar7 = memchr(piVar9,0x7d,sVar8);
          if (pvVar7 == (void *)0x0) {
            pbVar2 = (this_00->context).
                     super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                     .out_.container;
            sVar3 = pbVar2->_M_string_length;
            std::__cxx11::string::resize((ulong)pbVar2,(char)sVar3 + (char)sVar8);
            if (piVar9 != piVar6) {
              memmove((pbVar2->_M_dataplus)._M_p + sVar3,piVar9,sVar8);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
            .out_.container = pbVar2;
LAB_001150a8:
            bVar4 = false;
          }
          else {
            piVar1 = (internal *)((long)pvVar7 + 1);
            if ((piVar1 == piVar6) || (*piVar1 != (internal)0x7d)) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
              goto LAB_001150a8;
            }
            pbVar2 = (this_00->context).
                     super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                     .out_.container;
            sVar3 = pbVar2->_M_string_length;
            std::__cxx11::string::resize((ulong)pbVar2,(char)sVar3 + ((char)piVar1 - (char)piVar9));
            if ((long)piVar1 - (long)piVar9 != 0) {
              memmove((pbVar2->_M_dataplus)._M_p + sVar3,piVar9,(long)piVar1 - (long)piVar9);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
            .out_.container = pbVar2;
            piVar9 = (internal *)((long)pvVar7 + 2);
            bVar4 = true;
          }
        } while (bVar4);
      }
      piVar6 = piVar6 + 1;
      if (piVar6 == end) {
        error_handler::on_error((error_handler *)this_00,"invalid format string");
        goto LAB_001151e5;
      }
      if (*piVar6 == (internal)0x7b) {
        pbVar2 = (this_00->context).
                 super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                 .out_.container;
        sVar3 = pbVar2->_M_string_length;
        std::__cxx11::string::resize((ulong)pbVar2,(char)sVar3 + '\x01');
        *(internal *)((pbVar2->_M_dataplus)._M_p + sVar3) = *piVar6;
        (this_00->context).
        super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
        .out_.container = pbVar2;
LAB_00115263:
        this = piVar6 + 1;
        bVar4 = true;
      }
      else {
        if (*piVar6 == (internal)0x7d) {
          basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
          ::next_arg((format_arg *)&local_58.string,&this_00->context);
          (this_00->arg).type_ = local_48;
          (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
          (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_00115258:
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
          ::on_replacement_field(this_00,(char *)piVar6);
          goto LAB_00115263;
        }
        local_58._0_8_ = this_00;
        piVar6 = (internal *)
                 parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>&,char>>
                           ((char *)piVar6,(char *)end,
                            (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_&,_char>
                             *)&local_58.string);
        if (piVar6 == end) {
          iVar5 = (internal)0x0;
        }
        else {
          iVar5 = *piVar6;
        }
        if (iVar5 == (internal)0x3a) {
          piVar6 = (internal *)
                   format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                   ::on_format_specs(this_00,(char *)(piVar6 + 1),(char *)end);
          if ((piVar6 != end) && (*piVar6 == (internal)0x7d)) goto LAB_00115263;
          message = "unknown format specifier";
        }
        else {
          if (iVar5 == (internal)0x7d) goto LAB_00115258;
          message = "missing \'}\' in format string";
        }
        error_handler::on_error((error_handler *)this_00,message);
        bVar4 = false;
      }
    }
    else {
      do {
        sVar8 = (long)end - (long)piVar9;
        pvVar7 = memchr(piVar9,0x7d,sVar8);
        if (pvVar7 == (void *)0x0) {
          pbVar2 = (this_00->context).
                   super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                   .out_.container;
          sVar3 = pbVar2->_M_string_length;
          std::__cxx11::string::resize((ulong)pbVar2,(char)sVar3 + (char)sVar8);
          if (piVar9 != end) {
            memmove((pbVar2->_M_dataplus)._M_p + sVar3,piVar9,sVar8);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
          .out_.container = pbVar2;
LAB_001151d9:
          bVar4 = false;
        }
        else {
          piVar6 = (internal *)((long)pvVar7 + 1);
          if ((piVar6 == end) || (*piVar6 != (internal)0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_001151d9;
          }
          pbVar2 = (this_00->context).
                   super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                   .out_.container;
          sVar3 = pbVar2->_M_string_length;
          std::__cxx11::string::resize((ulong)pbVar2,(char)sVar3 + ((char)piVar6 - (char)piVar9));
          if ((long)piVar6 - (long)piVar9 != 0) {
            memmove((pbVar2->_M_dataplus)._M_p + sVar3,piVar9,(long)piVar6 - (long)piVar9);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
          .out_.container = pbVar2;
          piVar9 = (internal *)((long)pvVar7 + 2);
          bVar4 = true;
        }
      } while (bVar4);
LAB_001151e5:
      bVar4 = false;
    }
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}